

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
          (KcpTcpEventLoop *this,InetAddress udpLisetenAddr,string *name,int seed,int kcpMode)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  sz_sock fd;
  Timestamp TVar3;
  undefined1 auVar4 [32];
  _Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>))(sznet::Timestamp)>
  local_78;
  function<void_(sznet::Timestamp)> local_60;
  Socket *local_40;
  
  EventLoop::EventLoop(&this->super_EventLoop);
  (this->super_EventLoop)._vptr_EventLoop = (_func_int **)&PTR__KcpTcpEventLoop_00163568;
  *(long *)&(this->m_udpLisetenAddr).field_0 = udpLisetenAddr.field_0._0_8_;
  *(long *)((long)&(this->m_udpLisetenAddr).field_0 + 8) = udpLisetenAddr.field_0._8_8_;
  *(long *)((long)&(this->m_udpLisetenAddr).field_0 + 0xc) = udpLisetenAddr.field_0._12_8_;
  *(undefined8 *)((long)&(this->m_udpLisetenAddr).field_0 + 0x14) = udpLisetenAddr.field_0._20_8_;
  fd = sockets::sz_udp_createnonblockingordie((uint)udpLisetenAddr.field_0.m_addr.sin_family);
  local_40 = &this->m_udpSocket;
  (this->m_udpSocket).m_sockfd = fd;
  (this->m_udpSocket).m_ableClose = true;
  Channel::Channel(&this->m_udpChannel,&this->super_EventLoop,fd);
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_tmpBuffer,4,0x400);
  p_Var1 = &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_addrConns)._M_h._M_buckets = &(this->m_addrConns)._M_h._M_single_bucket;
  (this->m_addrConns)._M_h._M_bucket_count = 1;
  (this->m_addrConns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_addrConns)._M_h._M_element_count = 0;
  (this->m_addrConns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  auVar4 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])&(this->m_addrConns)._M_h._M_rehash_policy._M_next_resize = auVar4;
  (this->m_netStatInfo).m_recvBytes = SUB168(auVar4._0_16_,0);
  (this->m_netStatInfo).m_sendBytes = SUB168(auVar4._0_16_,8);
  (this->m_prevNetStatInfo).m_recvBytes = SUB168(auVar4._16_16_,0);
  (this->m_prevNetStatInfo).m_sendBytes = SUB168(auVar4._16_16_,8);
  TVar3 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar3.m_microSecondsSinceEpoch;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->m_random,(long)seed);
  p_Var1 = &(this->m_crypts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_curConv = 0;
  (this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_curKcpConn).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_curKcpConn).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor + 8) = 0
  ;
  (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpWriteCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpConnectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_kcpMode = kcpMode;
  Socket::bindAddress(local_40,&this->m_udpLisetenAddr);
  Channel::enableReading(&this->m_udpChannel);
  local_78._M_f = (offset_in_KcpTcpEventLoop_to_subr)handleUdpRead;
  local_78._8_8_ = 0;
  local_78._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::KcpTcpEventLoop_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>_>)this;
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>))(sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_60,&local_78);
  std::function<void_(sznet::Timestamp)>::operator=(&(this->m_udpChannel).m_readCallback,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

KcpTcpEventLoop::KcpTcpEventLoop(const InetAddress udpLisetenAddr, string name, int seed, int kcpMode) :
	EventLoop(),
	m_udpLisetenAddr(udpLisetenAddr),
	m_udpSocket(sockets::sz_udp_createnonblockingordie(udpLisetenAddr.family())),
	m_udpChannel(this, m_udpSocket.fd()),
	m_calcNetLastTime(Timestamp::now()),
	m_random(seed),
	m_curConv(0),
	m_name(name),
	m_kcpMode(kcpMode)
{
	m_udpSocket.bindAddress(m_udpLisetenAddr);
	m_udpChannel.enableReading();
	m_udpChannel.setReadCallback(std::bind(&KcpTcpEventLoop::handleUdpRead, this, std::placeholders::_1));
}